

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

uint __thiscall Assimp::SMDImporter::GetTextureIndex(SMDImporter *this,string *filename)

{
  pointer pbVar1;
  pointer pbVar2;
  char *__s1;
  char *__s2;
  int iVar3;
  uint uVar4;
  pointer pbVar5;
  
  pbVar1 = (this->aszTextures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->aszTextures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    __s1 = (filename->_M_dataplus)._M_p;
    if (__s1 == (char *)0x0) {
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                    ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    uVar4 = 0;
    pbVar5 = pbVar1;
    do {
      __s2 = (pbVar5->_M_dataplus)._M_p;
      if (__s2 == (char *)0x0) {
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                      ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar3 = strcasecmp(__s1,__s2);
      if (iVar3 == 0) {
        return uVar4;
      }
      pbVar5 = pbVar5 + 1;
      uVar4 = uVar4 + 1;
    } while (pbVar5 != pbVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->aszTextures,filename);
  return (uint)((ulong)((long)pbVar2 - (long)pbVar1) >> 5);
}

Assistant:

unsigned int SMDImporter::GetTextureIndex(const std::string& filename) {
    unsigned int iIndex = 0;
    for (std::vector<std::string>::const_iterator
            i =  aszTextures.begin();
            i != aszTextures.end();++i,++iIndex) {
        // case-insensitive ... it's a path
        if (0 == ASSIMP_stricmp ( filename.c_str(),(*i).c_str())) {
            return iIndex;
        }
    }
    iIndex = (unsigned int)aszTextures.size();
    aszTextures.push_back(filename);
    return iIndex;
}